

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderAngle(char *label,float *v_rad,float v_degrees_min,float v_degrees_max,
                       char *format)

{
  bool bVar1;
  char *format_00;
  float v_deg;
  float local_1c;
  float local_18;
  float local_14;
  
  format_00 = "%.0f deg";
  if (format != (char *)0x0) {
    format_00 = format;
  }
  local_1c = (*v_rad * 360.0) / 6.2831855;
  local_18 = v_degrees_max;
  local_14 = v_degrees_min;
  bVar1 = SliderScalar(label,8,&local_1c,&local_14,&local_18,format_00,1.0);
  *v_rad = (local_1c * 6.2831855) / 360.0;
  return bVar1;
}

Assistant:

bool ImGui::SliderAngle(const char* label, float* v_rad, float v_degrees_min, float v_degrees_max, const char* format)
{
    if (format == NULL)
        format = "%.0f deg";
    float v_deg = (*v_rad) * 360.0f / (2*IM_PI);
    bool value_changed = SliderFloat(label, &v_deg, v_degrees_min, v_degrees_max, format, 1.0f);
    *v_rad = v_deg * (2*IM_PI) / 360.0f;
    return value_changed;
}